

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::String> * __thiscall
kj::anon_unknown_36::WebSocketPipeEnd::getPreferredExtensions
          (Maybe<kj::String> *__return_storage_ptr__,WebSocketPipeEnd *this,ExtensionsContext ctx)

{
  WebSocket *pWVar1;
  WebSocketPipeImpl *pWVar2;
  char local_40 [8];
  char *local_38;
  size_t sStack_30;
  ArrayDisposer *local_28;
  
  pWVar2 = (this->out).own.ptr;
  pWVar1 = (pWVar2->destinationPumpingTo).ptr;
  if (pWVar1 == (WebSocket *)0x0) {
LAB_004081dd:
    pWVar1 = (pWVar2->destinationPumpingFrom).ptr;
    if (pWVar1 != (WebSocket *)0x0) {
      (*pWVar1->_vptr_WebSocket[0xb])(local_40,pWVar1,(ulong)ctx);
      if (local_40[0] != '\0') goto LAB_004081fc;
    }
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (*pWVar1->_vptr_WebSocket[0xb])(local_40,pWVar1,(ulong)ctx);
    if (local_40[0] == '\0') {
      pWVar2 = (this->out).own.ptr;
      goto LAB_004081dd;
    }
LAB_004081fc:
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.content.ptr = local_38;
    (__return_storage_ptr__->ptr).field_1.value.content.size_ = sStack_30;
    (__return_storage_ptr__->ptr).field_1.value.content.disposer = local_28;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::String> getPreferredExtensions(ExtensionsContext ctx) override {
    // We want to forward this call to whatever WebSocket the other end of the pipe is pumping
    // to/from, if any. We'll check them in an arbitrary order and take the first one we see.
    // But really, the hope is that both destinationPumpingTo and destinationPumpingFrom are in fact
    // the same object. If they aren't the same, then it's not really clear whose extensions we
    // should prefer; the choice here is arbitrary.
    KJ_IF_SOME(ws, out->destinationPumpingTo) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    KJ_IF_SOME(ws, out->destinationPumpingFrom) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    return kj::none;
  }